

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

_Bool ARM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  DecodeStatus DVar3;
  long lVar4;
  void *Decoder;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t Address;
  uint32_t insn;
  MCRegisterInfo *MRI;
  int feature;
  DecodeStatus DVar5;
  
  feature = (int)address;
  DVar5 = MCDisassembler_Fail;
  if (code_len < 4) goto LAB_00148c54;
  pcVar2 = instr->flat_insn->detail;
  MRI = (MCRegisterInfo *)size;
  if (pcVar2 != (cs_detail *)0x0) {
    memset(&pcVar2->field_6,0,0x5c8);
    for (lVar4 = 0x58; lVar4 != 0x5f8; lVar4 = lVar4 + 0x28) {
      puVar1 = instr->flat_insn->detail->regs_read + lVar4;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
    }
  }
  insn = *(uint32_t *)code;
  if (*(char *)(ud + 0x28) == '\x01') {
    insn = (uint)*code << 0x18 | (uint)code[1] << 0x10 | (uint)code[2] << 8 | (uint)code[3];
  }
  DVar3 = decodeInstruction_4(DecoderTableARM32,instr,insn,(ulong)*(uint *)(ud + 4),MRI,feature);
  if (DVar3 == MCDisassembler_Fail) {
    MCInst_clear(instr);
    DVar3 = decodeInstruction_4(DecoderTableVFP32,instr,insn,(ulong)*(uint *)(ud + 4),MRI,feature);
    if (DVar3 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      DVar3 = decodeInstruction_4(DecoderTableVFPV832,instr,insn,(ulong)*(uint *)(ud + 4),MRI,
                                  feature);
      if (DVar3 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        Decoder = (void *)(ulong)*(uint *)(ud + 4);
        DVar3 = decodeInstruction_4(DecoderTableNEONData32,instr,insn,(uint64_t)Decoder,MRI,feature)
        ;
        Address = extraout_RDX;
        if (DVar3 == MCDisassembler_Fail) {
          MCInst_clear(instr);
          Decoder = (void *)(ulong)*(uint *)(ud + 4);
          DVar3 = decodeInstruction_4(DecoderTableNEONLoadStore32,instr,insn,(uint64_t)Decoder,MRI,
                                      feature);
          Address = extraout_RDX_00;
          if (DVar3 == MCDisassembler_Fail) {
            MCInst_clear(instr);
            Decoder = (void *)(ulong)*(uint *)(ud + 4);
            DVar3 = decodeInstruction_4(DecoderTableNEONDup32,instr,insn,(uint64_t)Decoder,MRI,
                                        feature);
            Address = extraout_RDX_01;
            if (DVar3 == MCDisassembler_Fail) {
              MCInst_clear(instr);
              DVar3 = decodeInstruction_4(DecoderTablev8NEON32,instr,insn,(ulong)*(uint *)(ud + 4),
                                          MRI,feature);
              if (DVar3 == MCDisassembler_Fail) {
                MCInst_clear(instr);
                DVar3 = decodeInstruction_4(DecoderTablev8Crypto32,instr,insn,
                                            (ulong)*(uint *)(ud + 4),MRI,feature);
                if (DVar3 == MCDisassembler_Fail) {
                  MCInst_clear(instr);
                  *size = 0;
                  goto LAB_00148c54;
                }
              }
              goto LAB_00148c4b;
            }
          }
        }
        DVar5 = DVar3;
        *size = 4;
        DVar3 = DecodePredicateOperand(instr,0xe,Address,Decoder);
        if (DVar3 == MCDisassembler_Fail) {
          DVar5 = MCDisassembler_Fail;
        }
        goto LAB_00148c54;
      }
    }
  }
LAB_00148c4b:
  *size = 4;
  DVar5 = MCDisassembler_SoftFail;
LAB_00148c54:
  return DVar5 != MCDisassembler_Fail;
}

Assistant:

bool ARM_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _ARM_getInstruction((cs_struct *)ud, instr, code, code_len, size, address);

	//return status == MCDisassembler_Success;
	return status != MCDisassembler_Fail;
}